

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void image_manipulation::crop_image(clip_image_u8 *image,clip_image_u8 *dst,int x,int y,int w,int h)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  reference pvVar5;
  int in_ECX;
  int in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  int dst_idx;
  int src_idx;
  int j;
  int i;
  int local_28;
  int local_24;
  
  *(int *)&(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start = in_R8D;
  *(int *)((long)&(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start + 4) = in_R9D;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_RSI,CONCAT44(in_EDX,in_ECX))
  ;
  for (local_24 = 0; local_24 < in_R9D; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
      iVar2 = ((in_ECX + local_24) * *in_RDI + in_EDX + local_28) * 3;
      iVar3 = (local_24 * in_R8D + local_28) * 3;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                          (long)iVar2);
      vVar1 = *pvVar4;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &(in_RSI->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish,(long)iVar3);
      *pvVar5 = vVar1;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                          (long)(iVar2 + 1));
      vVar1 = *pvVar4;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &(in_RSI->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish,(long)(iVar3 + 1));
      *pvVar5 = vVar1;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                          (long)(iVar2 + 2));
      vVar1 = *pvVar4;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &(in_RSI->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish,(long)(iVar3 + 2));
      *pvVar5 = vVar1;
    }
  }
  return;
}

Assistant:

static void crop_image(const clip_image_u8 & image, clip_image_u8 & dst, int x, int y, int w, int h) {
        dst.nx = w;
        dst.ny = h;
        dst.buf.resize(3 * w * h);

        for (int i = 0; i < h; ++i) {
            for (int j = 0; j < w; ++j) {
                int src_idx = 3 * ((y + i)*image.nx + (x + j));
                int dst_idx = 3 * (i*w + j);
                dst.buf[dst_idx]     = image.buf[src_idx];
                dst.buf[dst_idx + 1] = image.buf[src_idx + 1];
                dst.buf[dst_idx + 2] = image.buf[src_idx + 2];
            }
        }
    }